

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O2

vector<unsigned_short,_std::allocator<unsigned_short>_> *
dpfb::readCovarageTable
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          Stream *stream)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  StreamError *pSVar4;
  bool bVar5;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = streams::Stream::readU16Be(stream);
  if (uVar1 == 2) {
    uVar1 = streams::Stream::readU16Be(stream);
    while (bVar5 = uVar1 != 0, uVar1 = uVar1 - 1, bVar5) {
      uVar2 = streams::Stream::readU16Be(stream);
      uVar3 = streams::Stream::readU16Be(stream);
      (*stream->_vptr_Stream[7])(stream,2,1);
      if (uVar3 < uVar2) {
        pSVar4 = (StreamError *)__cxa_allocate_exception(0x10);
        str::format_abi_cxx11_
                  (&local_50,"Coverage table format 2 range start id (%u) > end id (%u)",
                   (ulong)uVar2,(ulong)uVar3);
        streams::StreamError::runtime_error(pSVar4,&local_50);
        __cxa_throw(pSVar4,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                (__return_storage_ptr__,
                 ((ulong)uVar3 - (ulong)uVar2) +
                 ((long)(__return_storage_ptr__->
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                        .super__Vector_impl_data._M_start >> 1) + 1);
      while (local_50._M_dataplus._M_p._0_2_ = uVar2, uVar2 <= uVar3) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict4 *)&local_50);
        uVar2 = (uint16_t)local_50._M_dataplus._M_p + 1;
      }
    }
  }
  else {
    if (uVar1 != 1) {
      pSVar4 = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_(&local_50,"Unknown format of coverage table: %u",(ulong)(uint)uVar1);
      streams::StreamError::runtime_error(pSVar4,&local_50);
      __cxa_throw(pSVar4,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = streams::Stream::readU16Be(stream);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
              (__return_storage_ptr__,(ulong)uVar1);
    while (bVar5 = uVar1 != 0, uVar1 = uVar1 - 1, bVar5) {
      local_50._M_dataplus._M_p._0_2_ = streams::Stream::readU16Be(stream);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (__return_storage_ptr__,(unsigned_short *)&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::uint16_t> readCovarageTable(Stream& stream)
{
    std::vector<std::uint16_t> result;

    const auto coverageFormat = stream.readU16Be();
    if (coverageFormat == 1) {
        auto glyphCount = stream.readU16Be();
        result.reserve(glyphCount);
        while (glyphCount--)
            result.push_back(stream.readU16Be());
    } else if (coverageFormat == 2) {
        auto rangeCount = stream.readU16Be();
        while (rangeCount--) {
            const auto startGlyphId = stream.readU16Be();
            const auto endGlyphId = stream.readU16Be();
            // Skip startCoverageIndex
            stream.seek(
                sizeof(std::uint16_t), SeekOrigin::cur);

            if (startGlyphId > endGlyphId)
                throw StreamError(str::format(
                    "Coverage table format 2 range start id "
                    "(%" PRIu16 ") > end id (%" PRIu16 ")",
                    startGlyphId,
                    endGlyphId));

            result.reserve(
                result.size() + endGlyphId - startGlyphId + 1);
            for (auto i = startGlyphId; i <= endGlyphId; ++ i)
                result.push_back(i);
        }
    } else
        throw StreamError(str::format(
            "Unknown format of coverage table: %" PRIu16,
            coverageFormat));

    return result;
}